

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::SIVTest
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair,
          DistanceVector *distance_vector)

{
  int64_t iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  type *ppSVar5;
  type *ppSVar6;
  SERecurrentNode *destination;
  SERecurrentNode *this_00;
  SENode *pSVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SENode *pSVar8;
  size_type sVar9;
  reference ppSVar10;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  undefined4 local_1e0;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
  local_190;
  SERecurrentNode *local_188;
  SERecurrentNode *destination_recurrent_expr;
  SERecurrentNode *local_178;
  SERecurrentNode *source_recurrent_expr;
  string local_168;
  undefined1 local_148 [8];
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_recurrent_nodes;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_recurrent_nodes;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  int64_t local_78;
  int64_t destination_induction_count;
  int64_t source_induction_count;
  SENode *destination_node;
  SENode *source_node;
  string local_50;
  DistanceEntry *local_30;
  DistanceEntry *distance_entry;
  DistanceVector *distance_vector_local;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair_local;
  LoopDependenceAnalysis *this_local;
  
  distance_entry = (DistanceEntry *)distance_vector;
  distance_vector_local = (DistanceVector *)subscript_pair;
  subscript_pair_local = (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)this;
  local_30 = GetDistanceEntryForSubscriptPair(this,subscript_pair,distance_vector);
  if (local_30 == (DistanceEntry *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "SIVTest could not find a DistanceEntry for subscript_pair. Exiting",
               (allocator<char> *)((long)&source_node + 7));
    PrintDebug(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)((long)&source_node + 7));
  }
  ppSVar5 = std::get<0ul,spvtools::opt::SENode*,spvtools::opt::SENode*>
                      ((pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                       distance_vector_local);
  destination_node = *ppSVar5;
  ppSVar6 = std::get<1ul,spvtools::opt::SENode*,spvtools::opt::SENode*>
                      ((pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                       distance_vector_local);
  source_induction_count = (int64_t)*ppSVar6;
  destination_induction_count = CountInductionVariables(this,destination_node);
  local_78 = CountInductionVariables(this,(SENode *)source_induction_count);
  if (destination_induction_count == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Found source has no induction variable.",&local_99);
    PrintDebug(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    pSVar8 = destination_node;
    destination = (SERecurrentNode *)(**(code **)(*(long *)source_induction_count + 0x30))();
    this_00 = (SERecurrentNode *)(**(code **)(*(long *)source_induction_count + 0x30))();
    pSVar7 = SERecurrentNode::GetCoefficient(this_00);
    bVar2 = WeakZeroSourceSIVTest(this,pSVar8,destination,pSVar7,local_30);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Proved independence with WeakZeroSourceSIVTest.",&local_c1);
      PrintDebug(this,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      local_30->dependence_information = DIRECTION;
      local_30->direction = NONE;
      this_local._7_1_ = 1;
      goto LAB_00a3f3ab;
    }
  }
  if (local_78 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Found destination has no induction variable.",&local_e9);
    PrintDebug(this,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    iVar3 = (*destination_node->_vptr_SENode[6])();
    iVar1 = source_induction_count;
    iVar4 = (*destination_node->_vptr_SENode[6])();
    pSVar8 = SERecurrentNode::GetCoefficient((SERecurrentNode *)CONCAT44(extraout_var_00,iVar4));
    bVar2 = WeakZeroDestinationSIVTest
                      (this,(SERecurrentNode *)CONCAT44(extraout_var,iVar3),(SENode *)iVar1,pSVar8,
                       local_30);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"Proved independence with WeakZeroDestinationSIVTest.",
                 (allocator<char> *)
                 ((long)&source_recurrent_nodes.
                         super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      PrintDebug(this,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&source_recurrent_nodes.
                         super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_30->dependence_information = DIRECTION;
      local_30->direction = NONE;
      this_local._7_1_ = 1;
      goto LAB_00a3f3ab;
    }
  }
  SENode::CollectRecurrentNodes
            ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)&destination_recurrent_nodes.
                 super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,destination_node);
  SENode::CollectRecurrentNodes
            ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)local_148,(SENode *)source_induction_count);
  sVar9 = std::
          vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
          ::size((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                  *)&destination_recurrent_nodes.
                     super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((sVar9 == 1) &&
     (sVar9 = std::
              vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              ::size((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                      *)local_148), sVar9 == 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"Found source and destination have 1 induction variable.",
               (allocator<char> *)((long)&source_recurrent_expr + 7));
    PrintDebug(this,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)((long)&source_recurrent_expr + 7));
    destination_recurrent_expr =
         (SERecurrentNode *)
         std::
         vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
         ::begin((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                  *)&destination_recurrent_nodes.
                     super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ppSVar10 = __gnu_cxx::
               __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
               ::operator*((__normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
                            *)&destination_recurrent_expr);
    local_178 = *ppSVar10;
    local_190._M_current =
         (SERecurrentNode **)
         std::
         vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
         ::begin((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                  *)local_148);
    ppSVar10 = __gnu_cxx::
               __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
               ::operator*(&local_190);
    local_188 = *ppSVar10;
    pSVar8 = SERecurrentNode::GetCoefficient(local_178);
    pSVar7 = SERecurrentNode::GetCoefficient(local_188);
    if (pSVar8 != pSVar7) {
LAB_00a3f21b:
      pSVar8 = SERecurrentNode::GetCoefficient(local_178);
      pSVar7 = SERecurrentNode::GetCoefficient(local_188);
      pSVar7 = ScalarEvolutionAnalysis::CreateNegation(&this->scalar_evolution_,pSVar7);
      if (pSVar8 == pSVar7) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,"Found source coefficient = -destination coefficient.",
                   &local_201);
        PrintDebug(this,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator(&local_201);
        pSVar8 = destination_node;
        iVar1 = source_induction_count;
        pSVar7 = SERecurrentNode::GetCoefficient(local_178);
        bVar2 = WeakCrossingSIVTest(this,pSVar8,(SENode *)iVar1,pSVar7,local_30);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,"Proved independence with WeakCrossingSIVTest",&local_229)
          ;
          PrintDebug(this,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator(&local_229);
          local_30->dependence_information = DIRECTION;
          local_30->direction = NONE;
          this_local._7_1_ = 1;
          goto LAB_00a3f393;
        }
      }
      goto LAB_00a3f385;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Found source and destination share coefficient.",&local_1b1);
    PrintDebug(this,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    pSVar8 = destination_node;
    iVar1 = source_induction_count;
    pSVar7 = SERecurrentNode::GetCoefficient(local_178);
    bVar2 = StrongSIVTest(this,pSVar8,(SENode *)iVar1,pSVar7,local_30);
    if (!bVar2) goto LAB_00a3f21b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"Proved independence with StrongSIVTest",&local_1d9);
    PrintDebug(this,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    local_30->dependence_information = DIRECTION;
    local_30->direction = NONE;
    this_local._7_1_ = 1;
  }
  else {
LAB_00a3f385:
    this_local._7_1_ = 0;
  }
LAB_00a3f393:
  local_1e0 = 1;
  std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>::
  ~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           *)local_148);
  std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>::
  ~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           *)&destination_recurrent_nodes.
              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00a3f3ab:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LoopDependenceAnalysis::SIVTest(
    const std::pair<SENode*, SENode*>& subscript_pair,
    DistanceVector* distance_vector) {
  DistanceEntry* distance_entry =
      GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
  if (!distance_entry) {
    PrintDebug(
        "SIVTest could not find a DistanceEntry for subscript_pair. Exiting");
  }

  SENode* source_node = std::get<0>(subscript_pair);
  SENode* destination_node = std::get<1>(subscript_pair);

  int64_t source_induction_count = CountInductionVariables(source_node);
  int64_t destination_induction_count =
      CountInductionVariables(destination_node);

  // If the source node has no induction variables we can apply a
  // WeakZeroSrcTest.
  if (source_induction_count == 0) {
    PrintDebug("Found source has no induction variable.");
    if (WeakZeroSourceSIVTest(
            source_node, destination_node->AsSERecurrentNode(),
            destination_node->AsSERecurrentNode()->GetCoefficient(),
            distance_entry)) {
      PrintDebug("Proved independence with WeakZeroSourceSIVTest.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    }
  }

  // If the destination has no induction variables we can apply a
  // WeakZeroDestTest.
  if (destination_induction_count == 0) {
    PrintDebug("Found destination has no induction variable.");
    if (WeakZeroDestinationSIVTest(
            source_node->AsSERecurrentNode(), destination_node,
            source_node->AsSERecurrentNode()->GetCoefficient(),
            distance_entry)) {
      PrintDebug("Proved independence with WeakZeroDestinationSIVTest.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    }
  }

  // We now need to collect the SERecurrentExpr nodes from source and
  // destination. We do not handle cases where source or destination have
  // multiple SERecurrentExpr nodes.
  std::vector<SERecurrentNode*> source_recurrent_nodes =
      source_node->CollectRecurrentNodes();
  std::vector<SERecurrentNode*> destination_recurrent_nodes =
      destination_node->CollectRecurrentNodes();

  if (source_recurrent_nodes.size() == 1 &&
      destination_recurrent_nodes.size() == 1) {
    PrintDebug("Found source and destination have 1 induction variable.");
    SERecurrentNode* source_recurrent_expr = *source_recurrent_nodes.begin();
    SERecurrentNode* destination_recurrent_expr =
        *destination_recurrent_nodes.begin();

    // If the coefficients are identical we can apply a StrongSIVTest.
    if (source_recurrent_expr->GetCoefficient() ==
        destination_recurrent_expr->GetCoefficient()) {
      PrintDebug("Found source and destination share coefficient.");
      if (StrongSIVTest(source_node, destination_node,
                        source_recurrent_expr->GetCoefficient(),
                        distance_entry)) {
        PrintDebug("Proved independence with StrongSIVTest");
        distance_entry->dependence_information =
            DistanceEntry::DependenceInformation::DIRECTION;
        distance_entry->direction = DistanceEntry::Directions::NONE;
        return true;
      }
    }

    // If the coefficients are of equal magnitude and opposite sign we can
    // apply a WeakCrossingSIVTest.
    if (source_recurrent_expr->GetCoefficient() ==
        scalar_evolution_.CreateNegation(
            destination_recurrent_expr->GetCoefficient())) {
      PrintDebug("Found source coefficient = -destination coefficient.");
      if (WeakCrossingSIVTest(source_node, destination_node,
                              source_recurrent_expr->GetCoefficient(),
                              distance_entry)) {
        PrintDebug("Proved independence with WeakCrossingSIVTest");
        distance_entry->dependence_information =
            DistanceEntry::DependenceInformation::DIRECTION;
        distance_entry->direction = DistanceEntry::Directions::NONE;
        return true;
      }
    }
  }

  return false;
}